

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

void CMU462::Viewer::cursor_callback(GLFWwindow *window,double xpos,double ypos)

{
  if (HDPI != '\0') {
    xpos = xpos + xpos;
    ypos = ypos + ypos;
  }
  (**(code **)(*renderer + 0x38))((float)xpos,(float)ypos);
  return;
}

Assistant:

void Viewer::cursor_callback( GLFWwindow* window, double xpos, double ypos ) {

  // forward pan event to renderer
  if( HDPI ) {
    float cursor_x = 2 * xpos;
    float cursor_y = 2 * ypos;
    renderer->cursor_event(cursor_x, cursor_y);
  } else {
    float cursor_x = xpos;
    float cursor_y = ypos;
    renderer->cursor_event(cursor_x, cursor_y);
  }

}